

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* cfd::core::HDWallet::GetMnemonicWordlist
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,string *language)

{
  bool bVar1;
  CfdException *this;
  allocator local_51;
  string local_50;
  CfdSourceLocation local_30;
  string *local_18;
  string *language_local;
  
  local_18 = language;
  language_local = (string *)__return_storage_ptr__;
  bVar1 = CheckSupportedLanguages(language);
  if (!bVar1) {
    local_30.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_hdwallet.cpp"
                 ,0x2f);
    local_30.filename = local_30.filename + 1;
    local_30.line = 0x15a;
    local_30.funcname = "GetMnemonicWordlist";
    logger::warn<std::__cxx11::string_const&>
              (&local_30,"Not support language passed. language=[{}]",local_18);
    this = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_50,"Not support language passed.",&local_51);
    CfdException::CfdException(this,kCfdIllegalArgumentError,&local_50);
    __cxa_throw(this,&CfdException::typeinfo,CfdException::~CfdException);
  }
  WallyUtil::GetMnemonicWordlist(__return_storage_ptr__,local_18);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> HDWallet::GetMnemonicWordlist(
    const std::string& language) {
  if (!CheckSupportedLanguages(language)) {
    warn(
        CFD_LOG_SOURCE, "Not support language passed. language=[{}]",
        language);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Not support language passed.");
  }

  return WallyUtil::GetMnemonicWordlist(language);
}